

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laser_tag.cpp
# Opt level: O1

ostream * despot::operator<<(ostream *os,LaserTag *lasertag)

{
  long lVar1;
  long lVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  iVar3 = (**(code **)(*(long *)&lasertag->super_BaseTag + 0x10))(lasertag);
  if (0 < iVar3) {
    lVar8 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os,"State ",6);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,(int)lVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      poVar4 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar4,
                          (lasertag->super_BaseTag).opp_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar8]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      poVar4 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar4,
                          (lasertag->super_BaseTag).rob_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar8]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      iVar3 = despot::Floor::NumCells();
      plVar5 = (long *)std::ostream::operator<<((ostream *)poVar4,iVar3);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      (**(code **)(*(long *)&lasertag->super_BaseTag + 0xc0))
                (lasertag,(lasertag->super_BaseTag).states_.
                          super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar8],os);
      if (0 < LaserTag::NBEAMS) {
        lVar7 = 0;
        do {
          std::ostream::operator<<((ostream *)os,(int)lVar7);
          lVar1 = *(long *)&(lasertag->reading_distributions_).
                            super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar8].
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data;
          if (*(long *)(lVar1 + 8 + lVar7 * 0x18) != *(long *)(lVar1 + lVar7 * 0x18)) {
            lVar1 = lVar7 * 0x18;
            uVar6 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
              std::ostream::_M_insert<double>
                        (*(double *)
                          (*(long *)(*(long *)&(lasertag->reading_distributions_).
                                               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                               ._M_impl.super__Vector_impl_data + lVar1) + uVar6 * 8
                          ));
              uVar6 = uVar6 + 1;
              lVar2 = *(long *)&(lasertag->reading_distributions_).
                                super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data;
            } while (uVar6 < (ulong)(*(long *)(lVar2 + 8 + lVar1) - *(long *)(lVar2 + lVar1) >> 3));
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
          std::ostream::put((char)os);
          std::ostream::flush();
          lVar7 = lVar7 + 1;
        } while (lVar7 < LaserTag::NBEAMS);
      }
      lVar8 = lVar8 + 1;
      iVar3 = (**(code **)(*(long *)&lasertag->super_BaseTag + 0x10))(lasertag);
    } while (lVar8 < iVar3);
  }
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const LaserTag& lasertag) {
	for (int s = 0; s < lasertag.NumStates(); s++) {
		os << "State " << s << " " << lasertag.opp_[s] << " "
			<< lasertag.rob_[s] << " " << lasertag.floor_.NumCells() << endl;
		lasertag.PrintState(*lasertag.states_[s], os);

		for (int d = 0; d < lasertag.NBEAMS; d++) {
			os << d;
			for (int i = 0; i < lasertag.reading_distributions_[s][d].size(); i++)
				os << " " << lasertag.reading_distributions_[s][d][i];
			os << endl;
		}
	}
	return os;
}